

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deque.h
# Opt level: O1

void __thiscall
Deque<int,std::allocator<int>>::copy<std::allocator<int>>
          (Deque<int,std::allocator<int>> *this,Deque<int,_std::allocator<int>_> *other)

{
  DataBlock **ppDVar1;
  ulong uVar2;
  DataBlock *pDVar3;
  pointer piVar4;
  pointer piVar5;
  pointer piVar6;
  long lVar7;
  undefined8 *puVar8;
  long *plVar9;
  void *pvVar10;
  long lVar11;
  size_t __n;
  void *__dest;
  long lVar12;
  size_t sVar13;
  
  if ((other->current_).size_ != 0) {
    lVar12 = 0;
    sVar13 = 0;
    do {
      plVar9 = (long *)operator_new(0x18);
      ppDVar1 = (other->current_).begin_;
      uVar2 = (other->current_).allocSize_;
      if ((ulong)((long)ppDVar1 + (lVar12 - (long)(other->current_).arr_) >> 3) < uVar2) {
        lVar11 = 0;
      }
      else {
        lVar11 = -uVar2;
      }
      pDVar3 = ppDVar1[lVar11 + sVar13];
      piVar4 = pDVar3->buffer;
      *plVar9 = (long)piVar4;
      piVar5 = pDVar3->begin;
      plVar9[1] = (long)piVar5;
      piVar6 = pDVar3->end;
      plVar9[2] = (long)piVar6;
      pvVar10 = operator_new(0x400);
      __dest = (void *)(((long)piVar5 - (long)piVar4) + (long)pvVar10);
      __n = plVar9[2] - plVar9[1];
      if (__n != 0) {
        memmove(__dest,(void *)plVar9[1],__n);
      }
      plVar9[1] = (long)__dest;
      plVar9[2] = ((long)piVar6 - (long)piVar4) + (long)pvVar10;
      *plVar9 = (long)pvVar10;
      lVar11 = *(long *)(this + 0x50);
      lVar7 = *(long *)(this + 0x58);
      if (lVar11 != lVar7) {
        puVar8 = *(undefined8 **)(this + 0x48);
        *(undefined8 **)(this + 0x48) = puVar8 + 1;
        *puVar8 = plVar9;
        *(long *)(this + 0x50) = lVar11 + 1;
        if (*(long *)(this + 0x48) - *(long *)(this + 0x38) >> 3 == lVar7) {
          *(long *)(this + 0x48) = *(long *)(this + 0x38);
        }
      }
      lVar11 = *(long *)(this + 0x20);
      lVar7 = *(long *)(this + 0x28);
      if (lVar11 != lVar7) {
        puVar8 = *(undefined8 **)(this + 0x18);
        *(undefined8 **)(this + 0x18) = puVar8 + 1;
        *puVar8 = plVar9;
        *(long *)(this + 0x20) = lVar11 + 1;
        if (*(long *)(this + 0x18) - *(long *)(this + 8) >> 3 == lVar7) {
          *(long *)(this + 0x18) = *(long *)(this + 8);
        }
      }
      lVar11 = *(long *)(this + 0x80);
      lVar7 = *(long *)(this + 0x88);
      if (lVar11 != lVar7) {
        puVar8 = *(undefined8 **)(this + 0x78);
        *(undefined8 **)(this + 0x78) = puVar8 + 1;
        *puVar8 = plVar9;
        *(long *)(this + 0x80) = lVar11 + 1;
        if (*(long *)(this + 0x78) - *(long *)(this + 0x68) >> 3 == lVar7) {
          *(long *)(this + 0x78) = *(long *)(this + 0x68);
        }
      }
      sVar13 = sVar13 + 1;
      lVar12 = lVar12 + 8;
    } while (sVar13 != (other->current_).size_);
  }
  return;
}

Assistant:

void copy(const Deque<T, Alloc2> &other) {
        for (size_type i = 0; i != other.current_.size(); ++i) {
            DataBlock *block = new DataBlock(*other.current_[i]);
            auto beginOffset = block->begin - block->buffer;
            auto endOffset = block->end - block->buffer;

            pointer ptr = allocator_.allocate(DataBlock::SIZE);
            std::copy(block->begin, block->end, ptr + beginOffset);
            block->begin = ptr + beginOffset;
            block->end = ptr + endOffset;
            block->buffer = ptr;

            small_.push_back(block);
            current_.push_back(block);
            big_.push_back(block);
        }
    }